

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::expandGrid<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,vector<int,_std::allocator<int>_> *point,
          vector<double,_std::allocator<double>_> *value)

{
  MultiIndexSet *this_00;
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int *g;
  pointer piVar5;
  vector<int,_std::allocator<int>_> *this_01;
  int j_1;
  int j;
  long lVar6;
  ulong uVar7;
  int *g_1;
  allocator_type local_e9;
  vector<double,_std::allocator<double>_> xnode;
  vector<int,_std::allocator<int>_> levels;
  MultiIndexSet local_a8;
  vector<int,_std::allocator<int>_> graph;
  vector<double,_std::allocator<double>_> approximation;
  vector<double,_std::allocator<double>_> surp;
  
  this_00 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&xnode,
               (vector<int,_std::allocator<int>_> *)point);
    local_a8.cache_num_indexes =
         (int)((ulong)((long)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) / uVar7);
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.num_dimensions = uVar7;
    MultiIndexSet::operator=(this_00,&local_a8);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&xnode);
    iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&xnode,
               (vector<double,_std::allocator<double>_> *)value);
    local_a8.cache_num_indexes = 1;
    local_a8._12_4_ = 0;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.num_dimensions = (long)iVar3;
    StorageSet::operator=(&(this->super_BaseCanonicalGrid).values,(StorageSet *)&local_a8);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_a8.indexes);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&xnode);
    iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&xnode,
               (vector<double,_std::allocator<double>_> *)value);
    this_01 = &local_a8.indexes;
    local_a8.cache_num_indexes = 1;
    local_a8._12_4_ = 0;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.num_dimensions = (long)iVar3;
    Data2D<double>::operator=(&this->surpluses,(Data2D<double> *)&local_a8);
  }
  else {
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&xnode,
               (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_a8);
    for (lVar6 = 0; lVar6 < (this->super_BaseCanonicalGrid).num_dimensions; lVar6 = lVar6 + 1) {
      dVar2 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                        ((point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar6]);
      xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = dVar2;
    }
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&approximation,
               (long)(this->super_BaseCanonicalGrid).num_outputs,(allocator_type *)&local_a8);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&surp,
               (long)(this->super_BaseCanonicalGrid).num_outputs,(allocator_type *)&local_a8);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x10])
              (this,xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
               approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    ::std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::GridLocalPolynomial::expandGrid<(TasGrid::RuleLocal::erule)2>(std::vector<int,std::allocator<int>>const&,std::vector<double,std::allocator<double>>const&)::_lambda(double,double)_1_>
              (approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
               surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    getSubGraph<(TasGrid::RuleLocal::erule)2>(&graph,this,point);
    uVar7 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&levels,
               (vector<int,_std::allocator<int>_> *)point);
    local_a8.cache_num_indexes =
         (int)((ulong)((long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) / uVar7);
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish;
    local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.num_dimensions = uVar7;
    StorageSet::addValues
              (&(this->super_BaseCanonicalGrid).values,this_00,&local_a8,
               (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&levels);
    MultiIndexSet::addSortedIndexes(this_00,(vector<int,_std::allocator<int>_> *)point);
    iVar3 = MultiIndexSet::getSlot(this_00,(vector<int,_std::allocator<int>_> *)point);
    Data2D<double>::appendStrip(&this->surpluses,iVar3,&surp);
    for (piVar5 = graph.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 != graph.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
      if (iVar3 <= *piVar5) {
        *piVar5 = *piVar5 + 1;
      }
    }
    local_a8.num_dimensions = local_a8.num_dimensions & 0xffffffff00000000;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&levels,
               (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes,
               (value_type_conflict3 *)&local_a8,&local_e9);
    for (piVar5 = graph.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 != graph.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
      piVar1 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + (long)*piVar5 * (this->super_BaseCanonicalGrid).points.num_dimensions;
      iVar3 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(*piVar1);
      for (lVar6 = 1; lVar6 < (this->super_BaseCanonicalGrid).num_dimensions; lVar6 = lVar6 + 1) {
        iVar4 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(piVar1[lVar6]);
        iVar3 = iVar3 + iVar4;
      }
      levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [*piVar5] = iVar3;
      lVar6 = (long)(this->super_BaseCanonicalGrid).num_outputs;
      if (0 < lVar6) {
        memmove((this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (this->surpluses).stride * (long)*piVar5,
                (this->super_BaseCanonicalGrid).values.values.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start + (long)*piVar5 * (this->super_BaseCanonicalGrid).values.num_outputs,
                lVar6 << 3);
      }
    }
    iVar3 = this->top_level;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>
              ((Data2D<int> *)&local_a8,this_00);
    updateSurpluses<(TasGrid::RuleLocal::erule)2>
              (this,this_00,iVar3 + 1,&levels,(Data2D<int> *)&local_a8);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_a8.indexes.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&levels);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&graph);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&surp);
    this_01 = (vector<int,_std::allocator<int>_> *)&approximation;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this_01);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&xnode);
  buildTree(this);
  return;
}

Assistant:

void GridLocalPolynomial::expandGrid(const std::vector<int> &point, const std::vector<double> &value){
    if (points.empty()){ // only one point
        points = MultiIndexSet((size_t) num_dimensions, std::vector<int>(point));
        values = StorageSet(num_outputs, 1, std::vector<double>(value));
        surpluses = Data2D<double>(num_outputs, 1, std::vector<double>(value)); // one value is its own surplus
    }else{ // merge with existing points
        // compute the surplus for the point
        std::vector<double> xnode(num_dimensions);
        for(int j=0; j<num_dimensions; j++)
            xnode[j] = RuleLocal::getNode<effrule>(point[j]);

        std::vector<double> approximation(num_outputs), surp(num_outputs);
        evaluate(xnode.data(), approximation.data());
        std::transform(approximation.begin(), approximation.end(), value.begin(), surp.begin(), [&](double e, double v)->double{ return v - e; });

        std::vector<int> graph = getSubGraph<effrule>(point); // get the descendant nodes that must be updated later

        values.addValues(points, MultiIndexSet(num_dimensions, std::vector<int>(point)), value.data()); // added the value

        points.addSortedIndexes(point); // add the point
        int newindex = points.getSlot(point);
        surpluses.appendStrip(newindex, surp); // find the index of the new point

        for(auto &g : graph) if (g >= newindex) g++; // all points belowe the newindex have been shifted down by one spot

        std::vector<int> levels(points.getNumIndexes(), 0); // compute the levels, but only for the new indexes
        for(auto &g : graph){
            int const *pnt = points.getIndex(g);
            int l = RuleLocal::getLevel<effrule>(pnt[0]);
            for(int j=1; j<num_dimensions; j++) l += RuleLocal::getLevel<effrule>(pnt[j]);
            levels[g] = l;

            std::copy_n(values.getValues(g), num_outputs, surpluses.getStrip(g)); // reset the surpluses to the values (will be updated)
        }

        // compute the current DAG and update the surplused for the descendants
        updateSurpluses<effrule>(points, top_level + 1, levels, HierarchyManipulations::computeDAGup<effrule>(points));
    }
    buildTree(); // the tree is needed for evaluate(), must be rebuild every time the points set is updated
}